

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall
HEkk::choosePriceTechnique
          (HEkk *this,HighsInt price_strategy,double row_ep_density,bool *use_col_price,
          bool *use_row_price_w_switch)

{
  bool local_33;
  bool local_32;
  bool local_31;
  double density_for_column_price_switch;
  bool *use_row_price_w_switch_local;
  bool *use_col_price_local;
  double row_ep_density_local;
  HighsInt price_strategy_local;
  HEkk *this_local;
  
  local_31 = true;
  if (price_strategy != 0) {
    local_32 = price_strategy == 3 && 0.75 < row_ep_density;
    local_31 = local_32;
  }
  *use_col_price = local_31;
  local_33 = price_strategy == 2 || price_strategy == 3;
  *use_row_price_w_switch = local_33;
  return;
}

Assistant:

void HEkk::choosePriceTechnique(const HighsInt price_strategy,
                                const double row_ep_density,
                                bool& use_col_price,
                                bool& use_row_price_w_switch) {
  // By default switch to column PRICE when pi_p has at least this
  // density
  const double density_for_column_price_switch = 0.75;
  use_col_price = (price_strategy == kSimplexPriceStrategyCol) ||
                  (price_strategy == kSimplexPriceStrategyRowSwitchColSwitch &&
                   row_ep_density > density_for_column_price_switch);
  use_row_price_w_switch =
      price_strategy == kSimplexPriceStrategyRowSwitch ||
      price_strategy == kSimplexPriceStrategyRowSwitchColSwitch;
}